

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_hdr_total_length(lws *wsi,lws_token_indexes h)

{
  int local_24;
  uint local_20;
  int len;
  int n;
  lws_token_indexes h_local;
  lws *wsi_local;
  
  local_24 = 0;
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    wsi_local._4_4_ = 0;
  }
  else {
    local_20 = (uint)((wsi->http).ah)->frag_index[h];
    if (local_20 == 0) {
      wsi_local._4_4_ = 0;
    }
    else {
      do {
        local_24 = (uint)((wsi->http).ah)->frags[(int)local_20].len + local_24;
        local_20 = (uint)((wsi->http).ah)->frags[(int)local_20].nfrag;
        if ((local_20 != 0) && (h != WSI_TOKEN_HTTP_COOKIE)) {
          local_24 = local_24 + 1;
        }
      } while (local_20 != 0);
      wsi_local._4_4_ = local_24;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_hdr_total_length(struct lws *wsi, enum lws_token_indexes h)
{
	int n;
	int len = 0;

	if (!wsi->http.ah)
		return 0;

	n = wsi->http.ah->frag_index[h];
	if (!n)
		return 0;
	do {
		len += wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (n && h != WSI_TOKEN_HTTP_COOKIE)
			++len;

	} while (n);

	return len;
}